

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>
Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Inferences::ALASCA::Demodulation::Rhs_*> *core;
  IteratorCore<Inferences::ALASCA::Demodulation::Rhs_*> *in_RDI;
  
  if (VirtualIterator<Inferences::ALASCA::Demodulation::Rhs*>::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Inferences::ALASCA::Demodulation::Rhs*>::getEmpty()
                                 ::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Inferences::ALASCA::Demodulation::Rhs_*> *)
             EmptyIterator<Inferences::ALASCA::Demodulation::Rhs*>::operator_new(0x3d13aa);
      EmptyIterator<Inferences::ALASCA::Demodulation::Rhs_*>::EmptyIterator
                ((EmptyIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Inferences::ALASCA::Demodulation::Rhs*>::getEmpty()::inst
                         );
    }
  }
  VirtualIterator((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)in_RDI,&getEmpty::inst
                 );
  return (VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }